

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::mark_by_class_dim(Omega_h *this,Mesh *mesh,Int ent_dim,Int class_dim)

{
  void *extraout_RDX;
  Read<signed_char> RVar1;
  Read<signed_char> local_78 [2];
  allocator local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  Read<signed_char> e2class_dim;
  Int class_dim_local;
  Int ent_dim_local;
  Mesh *mesh_local;
  
  e2class_dim.write_.shared_alloc_.direct_ptr._0_4_ = class_dim;
  e2class_dim.write_.shared_alloc_.direct_ptr._4_4_ = ent_dim;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"class_dim",&local_51);
  Mesh::get_array<signed_char>((Mesh *)local_30,(Int)mesh,(string *)(ulong)(uint)ent_dim);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  Read<signed_char>::Read(local_78,(Read<signed_char> *)local_30);
  each_eq_to<signed_char>(this,local_78,(char)e2class_dim.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::~Read(local_78);
  Read<signed_char>::~Read((Read<signed_char> *)local_30);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_by_class_dim(Mesh* mesh, Int ent_dim, Int class_dim) {
  auto e2class_dim = mesh->get_array<I8>(ent_dim, "class_dim");
  return each_eq_to(e2class_dim, static_cast<I8>(class_dim));
}